

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__tga_info(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  int iVar2;
  stbi_uc *psVar3;
  byte *pbVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  psVar3 = s->img_buffer;
  if (psVar3 < s->img_buffer_end) {
LAB_001278c1:
    s->img_buffer = psVar3 + 1;
  }
  else if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    psVar3 = s->img_buffer;
    goto LAB_001278c1;
  }
  pbVar4 = s->img_buffer;
  if (pbVar4 < s->img_buffer_end) {
LAB_001278f5:
    s->img_buffer = pbVar4 + 1;
    bVar6 = *pbVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar4 = s->img_buffer;
      goto LAB_001278f5;
    }
    bVar6 = 0;
  }
  if (1 < bVar6) goto LAB_00127907;
  pbVar4 = s->img_buffer;
  if (pbVar4 < s->img_buffer_end) {
LAB_00127952:
    s->img_buffer = pbVar4 + 1;
    bVar8 = *pbVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar4 = s->img_buffer;
      goto LAB_00127952;
    }
    bVar8 = 0;
  }
  if (bVar6 == 1) {
    if ((bVar8 & 0xf7) != 1) goto LAB_00127907;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00127a07:
      s->img_buffer = s->img_buffer + 4;
    }
    else {
      iVar1 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (3 < iVar1) goto LAB_00127a07;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,4 - iVar1);
    }
    pbVar4 = s->img_buffer;
    if (pbVar4 < s->img_buffer_end) {
LAB_00127a3e:
      s->img_buffer = pbVar4 + 1;
      bVar6 = *pbVar4;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        pbVar4 = s->img_buffer;
        goto LAB_00127a3e;
      }
      bVar6 = 0;
    }
    if ((0x20 < bVar6) || ((0x101018100U >> ((ulong)bVar6 & 0x3f) & 1) == 0)) goto LAB_00127907;
    if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
      iVar1 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (iVar1 < 4) {
        s->img_buffer = s->img_buffer_end;
        (*(s->io).skip)(s->io_user_data,4 - iVar1);
        goto LAB_00127ab8;
      }
    }
    s->img_buffer = s->img_buffer + 4;
  }
  else {
    if ((bVar8 & 0xf6) != 2) goto LAB_00127907;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00127aa4:
      s->img_buffer = s->img_buffer + 9;
    }
    else {
      iVar1 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (8 < iVar1) goto LAB_00127aa4;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,9 - iVar1);
    }
    bVar6 = 0;
  }
LAB_00127ab8:
  iVar1 = stbi__get16le(s);
  if ((iVar1 == 0) || (iVar2 = stbi__get16le(s), iVar2 == 0)) goto LAB_00127907;
  pbVar4 = s->img_buffer;
  if (pbVar4 < s->img_buffer_end) {
LAB_00127b10:
    s->img_buffer = pbVar4 + 1;
    bVar7 = *pbVar4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar4 = s->img_buffer;
      goto LAB_00127b10;
    }
    bVar7 = 0;
  }
  psVar3 = s->img_buffer;
  if (psVar3 < s->img_buffer_end) {
LAB_00127b4b:
    s->img_buffer = psVar3 + 1;
  }
  else if (s->read_from_callbacks != 0) {
    stbi__refill_buffer(s);
    psVar3 = s->img_buffer;
    goto LAB_00127b4b;
  }
  if (bVar6 == 0) {
    if (bVar7 < 0x10) {
LAB_00127bc0:
      uVar5 = 1;
      if (bVar7 != 8) {
        if (bVar7 == 0xf) goto LAB_00127bd8;
LAB_00127bfc:
        uVar5 = 0;
      }
    }
    else if ((bVar7 == 0x20) || (bVar7 == 0x18)) {
      uVar5 = (uint)(bVar7 >> 3);
    }
    else {
      if (bVar7 != 0x10) goto LAB_00127bfc;
      uVar5 = (bVar8 & 0xf7) == 3 ^ 3;
    }
  }
  else {
    if ((bVar7 != 8) && (bVar7 != 0x10)) goto LAB_00127907;
    bVar7 = bVar6;
    if (bVar6 < 0x10) goto LAB_00127bc0;
    if ((bVar6 == 0x20) || (bVar6 == 0x18)) {
      uVar5 = (uint)(bVar6 >> 3);
      goto LAB_00127c0a;
    }
    if (bVar6 != 0x10) goto LAB_00127bfc;
LAB_00127bd8:
    uVar5 = 3;
  }
LAB_00127c0a:
  if (uVar5 != 0) {
    if (x != (int *)0x0) {
      *x = iVar1;
    }
    if (y != (int *)0x0) {
      *y = iVar2;
    }
    if (comp == (int *)0x0) {
      return 1;
    }
    *comp = uVar5;
    return 1;
  }
LAB_00127907:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 0;
}

Assistant:

static int stbi__tga_info(stbi__context *s, int *x, int *y, int *comp)
{
    int tga_w, tga_h, tga_comp, tga_image_type, tga_bits_per_pixel, tga_colormap_bpp;
    int sz, tga_colormap_type;
    stbi__get8(s);                   // discard Offset
    tga_colormap_type = stbi__get8(s); // colormap type
    if( tga_colormap_type > 1 ) {
        stbi__rewind(s);
        return 0;      // only RGB or indexed allowed
    }
    tga_image_type = stbi__get8(s); // image type
    if ( tga_colormap_type == 1 ) { // colormapped (paletted) image
        if (tga_image_type != 1 && tga_image_type != 9) {
            stbi__rewind(s);
            return 0;
        }
        stbi__skip(s,4);       // skip index of first colormap entry and number of entries
        sz = stbi__get8(s);    //   check bits per palette color entry
        if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) {
            stbi__rewind(s);
            return 0;
        }
        stbi__skip(s,4);       // skip image x and y origin
        tga_colormap_bpp = sz;
    } else { // "normal" image w/o colormap - only RGB or grey allowed, +/- RLE
        if ( (tga_image_type != 2) && (tga_image_type != 3) && (tga_image_type != 10) && (tga_image_type != 11) ) {
            stbi__rewind(s);
            return 0; // only RGB or grey allowed, +/- RLE
        }
        stbi__skip(s,9); // skip colormap specification and image x/y origin
        tga_colormap_bpp = 0;
    }
    tga_w = stbi__get16le(s);
    if( tga_w < 1 ) {
        stbi__rewind(s);
        return 0;   // test width
    }
    tga_h = stbi__get16le(s);
    if( tga_h < 1 ) {
        stbi__rewind(s);
        return 0;   // test height
    }
    tga_bits_per_pixel = stbi__get8(s); // bits per pixel
    stbi__get8(s); // ignore alpha bits
    if (tga_colormap_bpp != 0) {
        if((tga_bits_per_pixel != 8) && (tga_bits_per_pixel != 16)) {
            // when using a colormap, tga_bits_per_pixel is the size of the indexes
            // I don't think anything but 8 or 16bit indexes makes sense
            stbi__rewind(s);
            return 0;
        }
        tga_comp = stbi__tga_get_comp(tga_colormap_bpp, 0, NULL);
    } else {
        tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3) || (tga_image_type == 11), NULL);
    }
    if(!tga_comp) {
      stbi__rewind(s);
      return 0;
    }
    if (x) *x = tga_w;
    if (y) *y = tga_h;
    if (comp) *comp = tga_comp;
    return 1;                   // seems to have passed everything
}